

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraylist.c
# Opt level: O0

int array_list_put_idx(array_list *arr,size_t idx,void *data)

{
  int iVar1;
  void *data_local;
  size_t idx_local;
  array_list *arr_local;
  
  if (idx == 0xffffffffffffffff) {
    arr_local._4_4_ = -1;
  }
  else {
    iVar1 = array_list_expand_internal(arr,idx + 1);
    if (iVar1 == 0) {
      if ((idx < arr->length) && (arr->array[idx] != (void *)0x0)) {
        (*arr->free_fn)(arr->array[idx]);
      }
      arr->array[idx] = data;
      if (arr->length < idx) {
        memset(arr->array + arr->length,0,(idx - arr->length) * 8);
      }
      if (arr->length <= idx) {
        arr->length = idx + 1;
      }
      arr_local._4_4_ = 0;
    }
    else {
      arr_local._4_4_ = -1;
    }
  }
  return arr_local._4_4_;
}

Assistant:

int array_list_put_idx(struct array_list *arr, size_t idx, void *data)
{
	if (idx > SIZE_T_MAX - 1)
		return -1;
	if (array_list_expand_internal(arr, idx + 1))
		return -1;
	if (idx < arr->length && arr->array[idx])
		arr->free_fn(arr->array[idx]);
	arr->array[idx] = data;
	if (idx > arr->length)
	{
		/* Zero out the arraylist slots in between the old length
		   and the newly added entry so we know those entries are
		   empty.
		   e.g. when setting array[7] in an array that used to be 
		   only 5 elements longs, array[5] and array[6] need to be
		   set to 0.
		 */
		memset(arr->array + arr->length, 0, (idx - arr->length) * sizeof(void *));
	}
	if (arr->length <= idx)
		arr->length = idx + 1;
	return 0;
}